

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsViewPrivate::clearRubberBand(QGraphicsViewPrivate *this)

{
  undefined4 uVar1;
  QAbstractScrollArea *this_00;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  QWidget *this_01;
  QWidget *rect;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QPointF _t2;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->dragMode == RubberBandDrag) && ((this->field_0x300 & 1) != 0)) &&
     (this->rubberBanding == true)) {
    this_00 = *(QAbstractScrollArea **)
               &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                field_0x8;
    if (this->viewportUpdateMode == FullViewportUpdate) {
      updateAll(this);
    }
    else if (this->viewportUpdateMode != NoViewportUpdate) {
      this_01 = QAbstractScrollArea::viewport(this_00);
      rect = QAbstractScrollArea::viewport(this_00);
      rubberBandRegion((QGraphicsViewPrivate *)&stack0xffffffffffffffd0,in_RSI,(QRect *)rect);
      QWidget::update(this_01,(QRegion *)&stack0xffffffffffffffd0);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffffd0);
    }
    this->rubberBanding = false;
    this->rubberBandSelectionOperation = ReplaceSelection;
    bVar4 = QRect::isNull(&this->rubberBandRect);
    if (!bVar4) {
      (this->rubberBandRect).x1 = 0;
      (this->rubberBandRect).y1 = 0;
      (this->rubberBandRect).x2 = -1;
      (this->rubberBandRect).y2 = -1;
      uVar1 = (this->rubberBandRect).x2;
      uVar2 = (this->rubberBandRect).y2;
      auVar3._4_4_ = uVar2;
      auVar3._0_4_ = uVar1;
      auVar3._8_8_ = 0;
      _t2.yp._4_4_ = 0;
      _t2._0_12_ = ZEXT812(0);
      QGraphicsView::rubberBandChanged
                ((QGraphicsView *)this_00,(QRect)(auVar3 << 0x40),_t2,(QPointF)ZEXT816(0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::clearRubberBand()
{
    Q_Q(QGraphicsView);
    if (dragMode != QGraphicsView::RubberBandDrag || !sceneInteractionAllowed || !rubberBanding)
        return;

    if (viewportUpdateMode != QGraphicsView::NoViewportUpdate) {
        if (viewportUpdateMode != QGraphicsView::FullViewportUpdate)
            q->viewport()->update(rubberBandRegion(q->viewport(), rubberBandRect));
        else
            updateAll();
    }

    rubberBanding = false;
    rubberBandSelectionOperation = Qt::ReplaceSelection;
    if (!rubberBandRect.isNull()) {
        rubberBandRect = QRect();
        emit q->rubberBandChanged(rubberBandRect, QPointF(), QPointF());
    }
}